

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMA_PERMANENT_Unmarshal(TPMA_PERMANENT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal((UINT32 *)target,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0xa1;
    if (((uint)*target & 0xfffff8f8) == 0) {
      TVar1 = 0;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMA_PERMANENT_Unmarshal(TPMA_PERMANENT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(*((UINT32 *)target) & (UINT32)0xfffff8f8)
        return TPM_RC_RESERVED_BITS;
    return TPM_RC_SUCCESS;
}